

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

bool __thiscall c4::yml::Parser::_handle_map_blck(Parser *this)

{
  Location LVar1;
  Location LVar2;
  Location LVar3;
  Location LVar4;
  Location LVar5;
  Location LVar6;
  Location LVar7;
  Location LVar8;
  Location LVar9;
  ro_substr pattern;
  ro_substr pattern_00;
  ro_substr pattern_01;
  ro_substr pattern_02;
  ro_substr pattern_03;
  ro_substr pattern_04;
  ro_substr pattern_05;
  ro_substr pattern_06;
  ro_substr pattern_07;
  ro_substr pattern_08;
  ro_substr chars;
  ro_substr chars_00;
  csubstr s_00;
  csubstr rem_00;
  csubstr rem_01;
  csubstr val;
  csubstr fmt;
  csubstr fmt_00;
  csubstr fmt_01;
  bool bVar10;
  error_flags eVar11;
  int iVar12;
  char *pcVar13;
  Parser *in_RDI;
  csubstr spc;
  bool is_quoted_1;
  csubstr s;
  char msg_10 [31];
  char msg_9 [31];
  char msg_7 [35];
  size_t pos;
  char msg_6 [35];
  bool is_quoted;
  char msg_5 [31];
  char msg_4 [31];
  char msg_3 [31];
  char msg_2 [31];
  char msg_1 [31];
  char msg [30];
  csubstr rem;
  size_t pos_1;
  char msg_8 [58];
  flag_t in_stack_fffffffffffff8d8;
  flag_t in_stack_fffffffffffff8dc;
  undefined4 in_stack_fffffffffffff8e0;
  undefined4 in_stack_fffffffffffff8e4;
  flag_t in_stack_fffffffffffff8e8;
  undefined4 in_stack_fffffffffffff8ec;
  undefined4 in_stack_fffffffffffff8f0;
  undefined4 in_stack_fffffffffffff8f4;
  char c;
  basic_substring<const_char> *in_stack_fffffffffffff8f8;
  undefined7 in_stack_fffffffffffff900;
  char in_stack_fffffffffffff907;
  basic_substring<const_char> *in_stack_fffffffffffff908;
  undefined7 in_stack_fffffffffffff910;
  undefined1 in_stack_fffffffffffff917;
  basic_substring<const_char> *in_stack_fffffffffffff918;
  Parser *in_stack_fffffffffffff920;
  undefined4 in_stack_fffffffffffff928;
  flag_t in_stack_fffffffffffff92c;
  Parser *in_stack_fffffffffffff930;
  pfn_error p_Var14;
  char *in_stack_fffffffffffff938;
  size_t in_stack_fffffffffffff940;
  size_t in_stack_fffffffffffff948;
  char *in_stack_fffffffffffff950;
  undefined7 in_stack_fffffffffffff958;
  undefined1 in_stack_fffffffffffff95f;
  Parser *in_stack_fffffffffffff980;
  undefined7 in_stack_fffffffffffff988;
  undefined1 in_stack_fffffffffffff98f;
  Parser *in_stack_fffffffffffff990;
  pfn_error in_stack_fffffffffffff998;
  Parser *in_stack_fffffffffffff9a0;
  Parser *in_stack_fffffffffffff9a8;
  pfn_error in_stack_fffffffffffff9b8;
  Parser *in_stack_fffffffffffff9c0;
  Parser *in_stack_fffffffffffff9e8;
  basic_substring<char_const> local_608 [16];
  basic_substring<char_const> local_5f8 [16];
  size_t in_stack_fffffffffffffa18;
  Parser *in_stack_fffffffffffffa20;
  basic_substring<char_const> local_5d8 [16];
  basic_substring<char_const> local_5c8 [8];
  undefined4 in_stack_fffffffffffffa40;
  flag_t in_stack_fffffffffffffa44;
  Parser *in_stack_fffffffffffffa48;
  char *in_stack_fffffffffffffa50;
  size_t in_stack_fffffffffffffa58;
  basic_substring<char_const> local_588 [24];
  basic_substring<const_char> local_570;
  flag_t local_560;
  flag_t fStack_55c;
  undefined4 uStack_558;
  undefined4 uStack_554;
  undefined4 uStack_548;
  undefined4 uStack_544;
  basic_substring<const_char> *local_540;
  char local_538 [40];
  undefined8 local_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  basic_substring<const_char> *local_4f0;
  char local_4e8 [16];
  Parser *in_stack_fffffffffffffb28;
  basic_substring<char_const> local_4c0 [16];
  char *local_4b0;
  char *local_4a8;
  basic_substring<char_const> local_4a0 [16];
  basic_substring<char_const> local_490 [16];
  basic_substring<char_const> local_480 [16];
  undefined8 local_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  basic_substring<const_char> *local_450;
  char local_448 [48];
  basic_substring<char_const> local_418 [16];
  basic_substring<char_const> local_408 [16];
  basic_substring<char_const> local_3f8 [16];
  char *local_3e8;
  ro_substr local_3e0;
  basic_substring<char_const> local_3d0 [7];
  undefined1 in_stack_fffffffffffffc37;
  Parser *in_stack_fffffffffffffc38;
  Parser *in_stack_fffffffffffffc48;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  basic_substring<const_char> *local_390;
  char local_388 [31];
  undefined1 in_stack_fffffffffffffc97;
  Parser *in_stack_fffffffffffffc98;
  ro_substr local_358;
  char *local_348;
  char *local_340;
  flag_t local_330;
  flag_t fStack_32c;
  undefined4 uStack_328;
  undefined4 uStack_324;
  flag_t local_320;
  undefined4 uStack_31c;
  undefined4 uStack_318;
  undefined4 uStack_314;
  basic_substring<const_char> *local_310;
  undefined1 local_308 [88];
  size_t local_2b0;
  size_t local_2a8;
  undefined4 local_2a0;
  undefined2 local_29c;
  undefined1 local_29a;
  size_t local_290;
  char *pcStack_288;
  size_t local_280;
  char *pcStack_278;
  basic_substring<const_char> *local_270;
  char *local_268;
  Parser *in_stack_fffffffffffffda0;
  char *in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdb0;
  undefined2 in_stack_fffffffffffffdb4;
  undefined1 in_stack_fffffffffffffdb6;
  undefined1 in_stack_fffffffffffffdb7;
  size_t in_stack_fffffffffffffdc0;
  Tree *in_stack_fffffffffffffdc8;
  size_t in_stack_fffffffffffffdd0;
  size_t sStack_228;
  basic_substring<const_char> *local_220;
  char *local_218;
  size_t local_210;
  size_t local_208;
  undefined4 local_200;
  undefined2 local_1fc;
  undefined1 local_1fa;
  char *local_1e0;
  char *pcStack_1d8;
  char *local_1d0;
  char *pcStack_1c8;
  basic_substring<const_char> *local_1c0;
  char *local_1b8;
  char *local_1b0;
  size_t local_1a8;
  flag_t local_1a0;
  undefined2 local_19c;
  undefined1 local_19a;
  size_t local_190;
  Tree *pTStack_188;
  char *local_180;
  size_t sStack_178;
  basic_substring<const_char> *local_170;
  char *local_168;
  size_t local_160;
  char *local_158;
  undefined4 local_150;
  undefined2 local_14c;
  basic_substring<const_char> local_148;
  bool local_129;
  char *local_128;
  basic_substring<const_char> *local_120;
  undefined1 local_111;
  basic_substring<const_char> *local_110;
  undefined1 local_101;
  bool *in_stack_ffffffffffffff00;
  undefined7 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0f;
  Parser *in_stack_ffffffffffffff10;
  Parser *in_stack_ffffffffffffff78;
  char *local_80;
  char *local_70;
  size_t sStack_68;
  size_t local_60;
  char *pcStack_58;
  basic_substring<const_char> *local_50;
  char local_48 [63];
  undefined1 local_9;
  
  local_148.str = (in_RDI->m_state->line_contents).rem.str;
  local_148.len = (in_RDI->m_state->line_contents).rem.len;
  bVar10 = has_all(in_RDI,4);
  if (!bVar10) {
    local_168 = (char *)0x6166206b63656863;
    local_160._0_1_ = 'i';
    local_160._1_1_ = 'l';
    local_160._2_1_ = 'e';
    local_160._3_1_ = 'd';
    local_160._4_1_ = ':';
    local_160._5_1_ = ' ';
    local_160._6_1_ = '(';
    local_160._7_1_ = 'h';
    local_158 = (char *)0x52286c6c615f7361;
    local_150 = 0x2950414d;
    local_14c = 0x29;
    eVar11 = get_error_flags();
    if (((eVar11 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
      trap_instruction();
    }
    p_Var14 = (in_RDI->m_stack).m_callbacks.m_error;
    Location::Location((Location *)CONCAT17(in_stack_fffffffffffff907,in_stack_fffffffffffff900),
                       (char *)in_stack_fffffffffffff8f8,
                       CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                       CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
                       CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
    in_stack_fffffffffffff8e8 = (flag_t)local_180;
    in_stack_fffffffffffff8ec = (undefined4)((ulong)local_180 >> 0x20);
    in_stack_fffffffffffff8f0 = (undefined4)sStack_178;
    in_stack_fffffffffffff8f4 = (undefined4)(sStack_178 >> 0x20);
    in_stack_fffffffffffff8d8 = (flag_t)local_190;
    in_stack_fffffffffffff8dc = (flag_t)(local_190 >> 0x20);
    in_stack_fffffffffffff8e0 = SUB84(pTStack_188,0);
    in_stack_fffffffffffff8e4 = (undefined4)((ulong)pTStack_188 >> 0x20);
    LVar1.super_LineCol.line._0_4_ = in_stack_fffffffffffff8e0;
    LVar1.super_LineCol.offset = local_190;
    LVar1.super_LineCol.line._4_4_ = in_stack_fffffffffffff8e4;
    LVar1.super_LineCol.col._0_4_ = in_stack_fffffffffffff8e8;
    LVar1.super_LineCol.col._4_4_ = in_stack_fffffffffffff8ec;
    LVar1.name.str._0_4_ = in_stack_fffffffffffff8f0;
    LVar1.name.str._4_4_ = in_stack_fffffffffffff8f4;
    LVar1.name.len = (size_t)local_170;
    (*p_Var14)((char *)&local_168,0x1e,LVar1,(in_RDI->m_stack).m_callbacks.m_user_data);
    in_stack_fffffffffffff8f8 = local_170;
  }
  bVar10 = has_none(in_RDI,0x10);
  if (!bVar10) {
    local_1b8 = (char *)0x6166206b63656863;
    local_1b0 = (char *)0x6828203a64656c69;
    local_1a8._0_1_ = 'a';
    local_1a8._1_1_ = 's';
    local_1a8._2_1_ = '_';
    local_1a8._3_1_ = 'n';
    local_1a8._4_1_ = 'o';
    local_1a8._5_1_ = 'n';
    local_1a8._6_1_ = 'e';
    local_1a8._7_1_ = '(';
    local_1a0 = 0x574f4c46;
    local_19c = 0x2929;
    local_19a = 0;
    eVar11 = get_error_flags();
    if (((eVar11 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
      trap_instruction();
    }
    p_Var14 = (in_RDI->m_stack).m_callbacks.m_error;
    in_stack_fffffffffffff9c0 = (Parser *)&local_1b8;
    Location::Location((Location *)CONCAT17(in_stack_fffffffffffff907,in_stack_fffffffffffff900),
                       (char *)in_stack_fffffffffffff8f8,
                       CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                       CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
                       CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
    in_stack_fffffffffffff8e8 = (flag_t)local_1d0;
    in_stack_fffffffffffff8ec = (undefined4)((ulong)local_1d0 >> 0x20);
    in_stack_fffffffffffff8f0 = SUB84(pcStack_1c8,0);
    in_stack_fffffffffffff8f4 = (undefined4)((ulong)pcStack_1c8 >> 0x20);
    in_stack_fffffffffffff8d8 = (flag_t)local_1e0;
    in_stack_fffffffffffff8dc = (flag_t)((ulong)local_1e0 >> 0x20);
    in_stack_fffffffffffff8e0 = SUB84(pcStack_1d8,0);
    in_stack_fffffffffffff8e4 = (undefined4)((ulong)pcStack_1d8 >> 0x20);
    LVar2.super_LineCol.line._0_4_ = in_stack_fffffffffffff8e0;
    LVar2.super_LineCol.offset = (size_t)local_1e0;
    LVar2.super_LineCol.line._4_4_ = in_stack_fffffffffffff8e4;
    LVar2.super_LineCol.col._0_4_ = in_stack_fffffffffffff8e8;
    LVar2.super_LineCol.col._4_4_ = in_stack_fffffffffffff8ec;
    LVar2.name.str._0_4_ = in_stack_fffffffffffff8f0;
    LVar2.name.str._4_4_ = in_stack_fffffffffffff8f4;
    LVar2.name.len = (size_t)local_1c0;
    (*p_Var14)((char *)in_stack_fffffffffffff9c0,0x1f,LVar2,
               (in_RDI->m_stack).m_callbacks.m_user_data);
    in_stack_fffffffffffff8f8 = local_1c0;
  }
  bVar10 = basic_substring<const_char>::begins_with(&local_148,'#');
  if (bVar10) {
    _scan_comment(in_stack_fffffffffffff9a8);
    return true;
  }
  bVar10 = has_any(in_RDI,0x100);
  if (bVar10) {
    bVar10 = has_none(in_RDI,0x40);
    if (!bVar10) {
      local_218 = (char *)0x6166206b63656863;
      local_210._0_1_ = 'i';
      local_210._1_1_ = 'l';
      local_210._2_1_ = 'e';
      local_210._3_1_ = 'd';
      local_210._4_1_ = ':';
      local_210._5_1_ = ' ';
      local_210._6_1_ = '(';
      local_210._7_1_ = 'h';
      local_208._0_1_ = 'a';
      local_208._1_1_ = 's';
      local_208._2_1_ = '_';
      local_208._3_1_ = 'n';
      local_208._4_1_ = 'o';
      local_208._5_1_ = 'n';
      local_208._6_1_ = 'e';
      local_208._7_1_ = '(';
      local_200 = 0x59454b52;
      local_1fc = 0x2929;
      local_1fa = 0;
      eVar11 = get_error_flags();
      if (((eVar11 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
        trap_instruction();
      }
      in_stack_fffffffffffff9b8 = (in_RDI->m_stack).m_callbacks.m_error;
      Location::Location((Location *)CONCAT17(in_stack_fffffffffffff907,in_stack_fffffffffffff900),
                         (char *)in_stack_fffffffffffff8f8,
                         CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                         CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
                         CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
      in_stack_fffffffffffff8e8 = (flag_t)in_stack_fffffffffffffdd0;
      in_stack_fffffffffffff8ec = (undefined4)(in_stack_fffffffffffffdd0 >> 0x20);
      in_stack_fffffffffffff8f0 = (undefined4)sStack_228;
      in_stack_fffffffffffff8f4 = (undefined4)(sStack_228 >> 0x20);
      in_stack_fffffffffffff8d8 = (flag_t)in_stack_fffffffffffffdc0;
      in_stack_fffffffffffff8dc = (flag_t)(in_stack_fffffffffffffdc0 >> 0x20);
      in_stack_fffffffffffff8e0 = SUB84(in_stack_fffffffffffffdc8,0);
      in_stack_fffffffffffff8e4 = (undefined4)((ulong)in_stack_fffffffffffffdc8 >> 0x20);
      LVar3.super_LineCol.line._0_4_ = in_stack_fffffffffffff8e0;
      LVar3.super_LineCol.offset = in_stack_fffffffffffffdc0;
      LVar3.super_LineCol.line._4_4_ = in_stack_fffffffffffff8e4;
      LVar3.super_LineCol.col._0_4_ = in_stack_fffffffffffff8e8;
      LVar3.super_LineCol.col._4_4_ = in_stack_fffffffffffff8ec;
      LVar3.name.str._0_4_ = in_stack_fffffffffffff8f0;
      LVar3.name.str._4_4_ = in_stack_fffffffffffff8f4;
      LVar3.name.len = (size_t)local_220;
      (*in_stack_fffffffffffff9b8)
                ((char *)&local_218,0x1f,LVar3,(in_RDI->m_stack).m_callbacks.m_user_data);
      in_stack_fffffffffffff8f8 = local_220;
    }
    bVar10 = has_none(in_RDI,0x80);
    if (!bVar10) {
      local_268 = (char *)0x6166206b63656863;
      in_stack_fffffffffffffda0 = (Parser *)0x6828203a64656c69;
      in_stack_fffffffffffffda8 = (char *)0x28656e6f6e5f7361;
      in_stack_fffffffffffffdb0 = 0x4c415652;
      in_stack_fffffffffffffdb4 = 0x2929;
      in_stack_fffffffffffffdb6 = 0;
      eVar11 = get_error_flags();
      if (((eVar11 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
        trap_instruction();
      }
      p_Var14 = (in_RDI->m_stack).m_callbacks.m_error;
      in_stack_fffffffffffff9a0 = (Parser *)&local_268;
      Location::Location((Location *)CONCAT17(in_stack_fffffffffffff907,in_stack_fffffffffffff900),
                         (char *)in_stack_fffffffffffff8f8,
                         CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                         CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
                         CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
      in_stack_fffffffffffff8e8 = (flag_t)local_280;
      in_stack_fffffffffffff8ec = (undefined4)(local_280 >> 0x20);
      in_stack_fffffffffffff8f0 = SUB84(pcStack_278,0);
      in_stack_fffffffffffff8f4 = (undefined4)((ulong)pcStack_278 >> 0x20);
      in_stack_fffffffffffff8d8 = (flag_t)local_290;
      in_stack_fffffffffffff8dc = (flag_t)(local_290 >> 0x20);
      in_stack_fffffffffffff8e0 = SUB84(pcStack_288,0);
      in_stack_fffffffffffff8e4 = (undefined4)((ulong)pcStack_288 >> 0x20);
      LVar4.super_LineCol.line._0_4_ = in_stack_fffffffffffff8e0;
      LVar4.super_LineCol.offset = local_290;
      LVar4.super_LineCol.line._4_4_ = in_stack_fffffffffffff8e4;
      LVar4.super_LineCol.col._0_4_ = in_stack_fffffffffffff8e8;
      LVar4.super_LineCol.col._4_4_ = in_stack_fffffffffffff8ec;
      LVar4.name.str._0_4_ = in_stack_fffffffffffff8f0;
      LVar4.name.str._4_4_ = in_stack_fffffffffffff8f4;
      LVar4.name.len = (size_t)local_270;
      (*p_Var14)((char *)in_stack_fffffffffffff9a0,0x1f,LVar4,
                 (in_RDI->m_stack).m_callbacks.m_user_data);
      in_stack_fffffffffffff8f8 = local_270;
    }
    addrem_flags((Parser *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),
                 in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8);
  }
  bVar10 = _handle_indentation(in_stack_fffffffffffffc48);
  if (bVar10) {
    return true;
  }
  bVar10 = has_any(in_RDI,0x40);
  if (bVar10) {
    bVar10 = has_none(in_RDI,0x100);
    if (!bVar10) {
      local_308[0x50] = 'c';
      local_308[0x51] = 'h';
      local_308[0x52] = 'e';
      local_308[0x53] = 'c';
      local_308[0x54] = 'k';
      local_308[0x55] = ' ';
      local_308[0x56] = 'f';
      local_308[0x57] = 'a';
      local_2b0._0_1_ = 'i';
      local_2b0._1_1_ = 'l';
      local_2b0._2_1_ = 'e';
      local_2b0._3_1_ = 'd';
      local_2b0._4_1_ = ':';
      local_2b0._5_1_ = ' ';
      local_2b0._6_1_ = '(';
      local_2b0._7_1_ = 'h';
      local_2a8._0_1_ = 'a';
      local_2a8._1_1_ = 's';
      local_2a8._2_1_ = '_';
      local_2a8._3_1_ = 'n';
      local_2a8._4_1_ = 'o';
      local_2a8._5_1_ = 'n';
      local_2a8._6_1_ = 'e';
      local_2a8._7_1_ = '(';
      local_2a0 = 0x54584e52;
      local_29c = 0x2929;
      local_29a = 0;
      eVar11 = get_error_flags();
      if (((eVar11 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
        trap_instruction();
      }
      in_stack_fffffffffffff998 = (in_RDI->m_stack).m_callbacks.m_error;
      in_stack_fffffffffffff990 = (Parser *)(local_308 + 0x50);
      Location::Location((Location *)CONCAT17(in_stack_fffffffffffff907,in_stack_fffffffffffff900),
                         (char *)in_stack_fffffffffffff8f8,
                         CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                         CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
                         CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
      in_stack_fffffffffffff8e8 = (flag_t)local_308._56_8_;
      in_stack_fffffffffffff8ec = SUB84(local_308._56_8_,4);
      in_stack_fffffffffffff8f0 = (undefined4)local_308._64_8_;
      in_stack_fffffffffffff8f4 = SUB84(local_308._64_8_,4);
      in_stack_fffffffffffff8d8 = (flag_t)local_308._40_8_;
      in_stack_fffffffffffff8dc = SUB84(local_308._40_8_,4);
      in_stack_fffffffffffff8e0 = (undefined4)local_308._48_8_;
      in_stack_fffffffffffff8e4 = SUB84(local_308._48_8_,4);
      LVar5.super_LineCol.line._0_4_ = in_stack_fffffffffffff8e0;
      LVar5.super_LineCol.offset = local_308._40_8_;
      LVar5.super_LineCol.line._4_4_ = in_stack_fffffffffffff8e4;
      LVar5.super_LineCol.col._0_4_ = in_stack_fffffffffffff8e8;
      LVar5.super_LineCol.col._4_4_ = in_stack_fffffffffffff8ec;
      LVar5.name.str._0_4_ = in_stack_fffffffffffff8f0;
      LVar5.name.str._4_4_ = in_stack_fffffffffffff8f4;
      LVar5.name.len = local_308._72_8_;
      (*in_stack_fffffffffffff998)
                ((char *)in_stack_fffffffffffff990,0x1f,LVar5,
                 (in_RDI->m_stack).m_callbacks.m_user_data);
      in_stack_fffffffffffff8f8 = (basic_substring<const_char> *)local_308._72_8_;
    }
    bVar10 = has_none(in_RDI,0x80);
    if (!bVar10) {
      local_308[0] = 'c';
      local_308[1] = 'h';
      local_308[2] = 'e';
      local_308[3] = 'c';
      local_308[4] = 'k';
      local_308[5] = ' ';
      local_308[6] = 'f';
      local_308[7] = 'a';
      local_308[8] = 'i';
      local_308[9] = 'l';
      local_308[10] = 'e';
      local_308[0xb] = 'd';
      local_308[0xc] = ':';
      local_308[0xd] = ' ';
      local_308[0xe] = '(';
      local_308[0xf] = 'h';
      local_308[0x10] = 'a';
      local_308[0x11] = 's';
      local_308[0x12] = '_';
      local_308[0x13] = 'n';
      local_308[0x14] = 'o';
      local_308[0x15] = 'n';
      local_308[0x16] = 'e';
      local_308[0x17] = '(';
      local_308._24_4_ = 0x4c415652;
      local_308._28_2_ = 0x2929;
      local_308[0x1e] = 0;
      eVar11 = get_error_flags();
      if (((eVar11 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
        trap_instruction();
      }
      p_Var14 = (in_RDI->m_stack).m_callbacks.m_error;
      in_stack_fffffffffffff988 = SUB87(p_Var14,0);
      in_stack_fffffffffffff98f = (undefined1)((ulong)p_Var14 >> 0x38);
      in_stack_fffffffffffff980 = (Parser *)local_308;
      Location::Location((Location *)CONCAT17(in_stack_fffffffffffff907,in_stack_fffffffffffff900),
                         (char *)in_stack_fffffffffffff8f8,
                         CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                         CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
                         CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
      (*(code *)CONCAT17(in_stack_fffffffffffff98f,in_stack_fffffffffffff988))
                (in_stack_fffffffffffff980,0x1f,(in_RDI->m_stack).m_callbacks.m_user_data);
      in_stack_fffffffffffff8d8 = local_330;
      in_stack_fffffffffffff8dc = fStack_32c;
      in_stack_fffffffffffff8e0 = uStack_328;
      in_stack_fffffffffffff8e4 = uStack_324;
      in_stack_fffffffffffff8e8 = local_320;
      in_stack_fffffffffffff8ec = uStack_31c;
      in_stack_fffffffffffff8f0 = uStack_318;
      in_stack_fffffffffffff8f4 = uStack_314;
      in_stack_fffffffffffff8f8 = local_310;
    }
    bVar10 = _scan_scalar_map_blck
                       (in_stack_ffffffffffffff10,
                        (csubstr *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                        in_stack_ffffffffffffff00);
    if (bVar10) {
      bVar10 = has_all(in_RDI,0x220);
      if (bVar10) {
        _append_key_val_null(in_stack_fffffffffffff9a0,(char *)in_stack_fffffffffffff998);
      }
      local_348 = local_148.str;
      local_340 = (char *)local_148.len;
      s_00.len = in_stack_fffffffffffff940;
      s_00.str = in_stack_fffffffffffff938;
      _store_scalar(in_stack_fffffffffffff930,s_00,in_stack_fffffffffffff92c);
      bVar10 = has_all(in_RDI,0x820);
      if (bVar10) {
        _append_key_val_null(in_stack_fffffffffffff9a0,(char *)in_stack_fffffffffffff998);
      }
      local_148.str = (in_RDI->m_state->line_contents).rem.str;
      local_148.len = (in_RDI->m_state->line_contents).rem.len;
      bVar10 = basic_substring<const_char>::begins_with(&local_148,':');
      if (bVar10) {
        addrem_flags((Parser *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),
                     in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8);
        _line_progressed(in_stack_fffffffffffff9c0,(size_t)in_stack_fffffffffffff9b8);
        local_148.str = (in_RDI->m_state->line_contents).rem.str;
        local_148.len = (in_RDI->m_state->line_contents).rem.len;
        basic_substring<char_const>::basic_substring<3ul>
                  ((basic_substring<char_const> *)&local_358,(char (*) [3])" \t");
        bVar10 = basic_substring<const_char>::begins_with_any(&local_148,local_358);
        if (bVar10) {
          bVar10 = _at_line_begin(in_RDI);
          if (bVar10) {
            memcpy(local_388,"check failed: (! _at_line_begin())",0x23);
            eVar11 = get_error_flags();
            if (((eVar11 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
              trap_instruction();
            }
            p_Var14 = (in_RDI->m_stack).m_callbacks.m_error;
            Location::Location((Location *)
                               CONCAT17(in_stack_fffffffffffff907,in_stack_fffffffffffff900),
                               (char *)in_stack_fffffffffffff8f8,
                               CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                               CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
                               CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
            in_stack_fffffffffffff8f0 = (undefined4)uStack_398;
            in_stack_fffffffffffff8f4 = (undefined4)((ulong)uStack_398 >> 0x20);
            LVar6.super_LineCol.line._0_4_ = (int)uStack_3a8;
            LVar6.super_LineCol.offset = local_3b0;
            LVar6.super_LineCol.line._4_4_ = (int)((ulong)uStack_3a8 >> 0x20);
            LVar6.super_LineCol.col._0_4_ = (int)local_3a0;
            LVar6.super_LineCol.col._4_4_ = (int)((ulong)local_3a0 >> 0x20);
            LVar6.name.str._0_4_ = in_stack_fffffffffffff8f0;
            LVar6.name.str._4_4_ = in_stack_fffffffffffff8f4;
            LVar6.name.len = (size_t)local_390;
            (*p_Var14)(local_388,0x23,LVar6,(in_RDI->m_stack).m_callbacks.m_user_data);
            in_stack_fffffffffffff8f8 = local_390;
          }
          basic_substring<char_const>::basic_substring<3ul>(local_3d0,(char (*) [3])" \t");
          chars.len._0_4_ = in_stack_fffffffffffff928;
          chars.str = (char *)in_stack_fffffffffffff920;
          chars.len._4_4_ = in_stack_fffffffffffff92c;
          pcVar13 = (char *)basic_substring<const_char>::first_not_of
                                      (in_stack_fffffffffffff918,chars,
                                       CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910)
                                      );
          if (local_148.len < pcVar13 && pcVar13 != (char *)0xffffffffffffffff) {
            eVar11 = get_error_flags();
            if (((eVar11 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
              trap_instruction();
            }
            handle_error(0x344e8b,(char *)0x1569,"check failed: %s","pos <= len || pos == npos");
          }
          if (pcVar13 == (char *)0xffffffffffffffff) {
            local_80 = (char *)local_148.len;
          }
          else {
            basic_substring<const_char>::basic_substring
                      ((basic_substring<const_char> *)
                       CONCAT17(in_stack_fffffffffffff907,in_stack_fffffffffffff900),
                       (char *)in_stack_fffffffffffff8f8,
                       CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0));
            local_148.str = (char *)in_stack_ffffffffffffff78;
          }
          local_148.len = (size_t)local_80;
          _line_progressed(in_stack_fffffffffffff9c0,(size_t)in_stack_fffffffffffff9b8);
        }
      }
      return true;
    }
    basic_substring<char_const>::basic_substring<3ul>
              ((basic_substring<char_const> *)&local_3e0,(char (*) [3])" \t");
    bVar10 = basic_substring<const_char>::begins_with_any(&local_148,local_3e0);
    if (bVar10) {
      basic_substring<char_const>::basic_substring<3ul>(local_3f8,(char (*) [3])" \t");
      chars_00.len._0_4_ = in_stack_fffffffffffff928;
      chars_00.str = (char *)in_stack_fffffffffffff920;
      chars_00.len._4_4_ = in_stack_fffffffffffff92c;
      local_3e8 = (char *)basic_substring<const_char>::first_not_of
                                    (in_stack_fffffffffffff918,chars_00,
                                     CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910));
      if (local_3e8 == (char *)0xffffffffffffffff) {
        local_3e8 = (char *)local_148.len;
      }
      _line_progressed(in_stack_fffffffffffff9c0,(size_t)in_stack_fffffffffffff9b8);
      return true;
    }
    iVar12 = basic_substring<const_char>::compare
                       (in_stack_fffffffffffff8f8,(char)((uint)in_stack_fffffffffffff8f4 >> 0x18));
    if (iVar12 != 0) {
      basic_substring<char_const>::basic_substring<3ul>(local_408,(char (*) [3])"? ");
      pattern.str._7_1_ = in_stack_fffffffffffff907;
      pattern.str._0_7_ = in_stack_fffffffffffff900;
      pattern.len = (size_t)in_stack_fffffffffffff908;
      bVar10 = basic_substring<const_char>::begins_with(in_stack_fffffffffffff8f8,pattern);
      if (!bVar10) {
        bVar10 = has_all(in_RDI,0x20);
        if ((bVar10) && (bVar10 = basic_substring<const_char>::begins_with(&local_148,':'), bVar10))
        {
          bVar10 = has_any(in_RDI,0x200);
          if (!bVar10) {
            _store_scalar_null(in_stack_fffffffffffff9a0,(char *)in_stack_fffffffffffff998);
          }
          addrem_flags((Parser *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),
                       in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8);
          _line_progressed(in_stack_fffffffffffff9c0,(size_t)in_stack_fffffffffffff9b8);
          local_148.str = (in_RDI->m_state->line_contents).rem.str;
          local_148.len = (in_RDI->m_state->line_contents).rem.len;
          bVar10 = basic_substring<const_char>::begins_with(&local_148,' ');
          if (bVar10) {
            bVar10 = _at_line_begin(in_RDI);
            if (bVar10) {
              memcpy(local_448,"check failed: (! _at_line_begin())",0x23);
              eVar11 = get_error_flags();
              if (((eVar11 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
                trap_instruction();
              }
              p_Var14 = (in_RDI->m_stack).m_callbacks.m_error;
              pcVar13 = local_448;
              Location::Location((Location *)
                                 CONCAT17(in_stack_fffffffffffff907,in_stack_fffffffffffff900),
                                 (char *)in_stack_fffffffffffff8f8,
                                 CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                                 CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
                                 CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
              in_stack_fffffffffffff8e8 = (flag_t)local_460;
              in_stack_fffffffffffff8ec = (undefined4)((ulong)local_460 >> 0x20);
              in_stack_fffffffffffff8f0 = (undefined4)uStack_458;
              in_stack_fffffffffffff8f4 = (undefined4)((ulong)uStack_458 >> 0x20);
              in_stack_fffffffffffff8e0 = (undefined4)uStack_468;
              in_stack_fffffffffffff8e4 = (undefined4)((ulong)uStack_468 >> 0x20);
              LVar7.super_LineCol.line._0_4_ = in_stack_fffffffffffff8e0;
              LVar7.super_LineCol.offset = local_470;
              LVar7.super_LineCol.line._4_4_ = in_stack_fffffffffffff8e4;
              LVar7.super_LineCol.col._0_4_ = in_stack_fffffffffffff8e8;
              LVar7.super_LineCol.col._4_4_ = in_stack_fffffffffffff8ec;
              LVar7.name.str._0_4_ = in_stack_fffffffffffff8f0;
              LVar7.name.str._4_4_ = in_stack_fffffffffffff8f4;
              LVar7.name.len = (size_t)local_450;
              (*p_Var14)(pcVar13,0x23,LVar7,(in_RDI->m_stack).m_callbacks.m_user_data);
              in_stack_fffffffffffff8f8 = local_450;
            }
            local_9 = 0x20;
            bVar10 = basic_substring<const_char>::begins_with
                               (&(in_RDI->m_state->line_contents).rem,' ');
            if (!bVar10) {
              memcpy(local_48,"check failed: (m_state->line_contents.rem.begins_with(c))",0x3a);
              eVar11 = get_error_flags();
              if (((eVar11 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
                trap_instruction();
              }
              p_Var14 = (in_RDI->m_stack).m_callbacks.m_error;
              Location::Location((Location *)
                                 CONCAT17(in_stack_fffffffffffff907,in_stack_fffffffffffff900),
                                 (char *)in_stack_fffffffffffff8f8,
                                 CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                                 CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
                                 CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
              LVar8.super_LineCol.line._0_4_ = (int)sStack_68;
              LVar8.super_LineCol.offset = (size_t)local_70;
              LVar8.super_LineCol.line._4_4_ = (int)(sStack_68 >> 0x20);
              LVar8.super_LineCol.col._0_4_ = (int)local_60;
              LVar8.super_LineCol.col._4_4_ = (int)(local_60 >> 0x20);
              LVar8.name.str._0_4_ = (int)pcStack_58;
              LVar8.name.str._4_4_ = (int)((ulong)pcStack_58 >> 0x20);
              LVar8.name.len = (size_t)local_50;
              (*p_Var14)(local_48,0x3a,LVar8,(in_RDI->m_stack).m_callbacks.m_user_data);
              in_stack_fffffffffffff8f8 = local_50;
            }
            basic_substring<const_char>::first_not_of
                      (in_stack_fffffffffffff908,in_stack_fffffffffffff907,
                       (size_t)in_stack_fffffffffffff8f8);
            _line_progressed(in_stack_fffffffffffff9c0,(size_t)in_stack_fffffffffffff9b8);
          }
          return true;
        }
        c = (char)((uint)in_stack_fffffffffffff8f4 >> 0x18);
        iVar12 = basic_substring<const_char>::compare(in_stack_fffffffffffff8f8,c);
        if (iVar12 == 0) {
LAB_002f8b64:
          bVar10 = has_all(in_RDI,0x200);
          if (!bVar10) {
            _store_scalar_null(in_stack_fffffffffffff9a0,(char *)in_stack_fffffffffffff998);
            rem_flags((Parser *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),
                      in_stack_fffffffffffff8dc);
          }
          addrem_flags((Parser *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),
                       in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8);
          local_101 = 0x3a;
          basic_substring<const_char>::compare(in_stack_fffffffffffff8f8,c);
          _line_progressed(in_stack_fffffffffffff9c0,(size_t)in_stack_fffffffffffff9b8);
          return true;
        }
        basic_substring<char_const>::basic_substring<3ul>(local_480,(char (*) [3])0x345ed3);
        pattern_01.str._7_1_ = in_stack_fffffffffffff907;
        pattern_01.str._0_7_ = in_stack_fffffffffffff900;
        pattern_01.len = (size_t)in_stack_fffffffffffff908;
        bVar10 = basic_substring<const_char>::begins_with(in_stack_fffffffffffff8f8,pattern_01);
        if (bVar10) goto LAB_002f8b64;
        basic_substring<char_const>::basic_substring<4ul>(local_490,(char (*) [4])0x33e630);
        pattern_02.str._7_1_ = in_stack_fffffffffffff907;
        pattern_02.str._0_7_ = in_stack_fffffffffffff900;
        pattern_02.len = (size_t)in_stack_fffffffffffff908;
        bVar10 = basic_substring<const_char>::begins_with(in_stack_fffffffffffff8f8,pattern_02);
        if (bVar10) {
          _end_stream(in_stack_fffffffffffffb28);
          _line_progressed(in_stack_fffffffffffff9c0,(size_t)in_stack_fffffffffffff9b8);
          return true;
        }
        basic_substring<char_const>::basic_substring<4ul>(local_4a0,(char (*) [4])"---");
        pattern_03.str._7_1_ = in_stack_fffffffffffff907;
        pattern_03.str._0_7_ = in_stack_fffffffffffff900;
        pattern_03.len = (size_t)in_stack_fffffffffffff908;
        bVar10 = basic_substring<const_char>::begins_with(in_stack_fffffffffffff8f8,pattern_03);
        if (bVar10) {
          local_4b0 = local_148.str;
          local_4a8 = (char *)local_148.len;
          rem_00.str._7_1_ = in_stack_fffffffffffff98f;
          rem_00.str._0_7_ = in_stack_fffffffffffff988;
          rem_00.len = (size_t)in_stack_fffffffffffff990;
          _start_new_doc(in_stack_fffffffffffff980,rem_00);
          return true;
        }
        bVar10 = _handle_types(in_stack_ffffffffffffff78);
        if (bVar10) {
          return true;
        }
        bVar10 = _handle_key_anchors_and_refs(in_stack_fffffffffffffa48);
        if (bVar10) {
          return true;
        }
        bVar10 = is_debugger_attached();
        if ((bVar10) && (bVar10 = is_debugger_attached(), bVar10)) {
          trap_instruction();
        }
        basic_substring<char_const>::basic_substring<19ul>
                  (local_4c0,(char (*) [19])"ERROR: parse error");
        fmt.len._0_4_ = in_stack_fffffffffffffdb0;
        fmt.str = in_stack_fffffffffffffda8;
        fmt.len._4_2_ = in_stack_fffffffffffffdb4;
        fmt.len._6_1_ = in_stack_fffffffffffffdb6;
        fmt.len._7_1_ = in_stack_fffffffffffffdb7;
        _err<>(in_stack_fffffffffffffda0,fmt);
        goto LAB_002f988d;
      }
    }
    basic_substring<char_const>::basic_substring<3ul>(local_418,(char (*) [3])"? ");
    pattern_00.str._7_1_ = in_stack_fffffffffffff907;
    pattern_00.str._0_7_ = in_stack_fffffffffffff900;
    pattern_00.len = (size_t)in_stack_fffffffffffff908;
    basic_substring<const_char>::begins_with(in_stack_fffffffffffff8f8,pattern_00);
    _line_progressed(in_stack_fffffffffffff9c0,(size_t)in_stack_fffffffffffff9b8);
    bVar10 = has_any(in_RDI,0x200);
    if (bVar10) {
      _append_key_val_null(in_stack_fffffffffffff9a0,(char *)in_stack_fffffffffffff998);
    }
    add_flags((Parser *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),
              in_stack_fffffffffffff8dc);
    local_129 = true;
  }
  else {
    bVar10 = has_any(in_RDI,0x80);
    if (bVar10) {
      bVar10 = has_none(in_RDI,0x100);
      if (!bVar10) {
        builtin_strncpy(local_4e8,"check failed: (h",0x10);
        in_stack_fffffffffffffb28 = (Parser *)0x28656e6f6e5f7361;
        eVar11 = get_error_flags();
        if (((eVar11 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
          trap_instruction();
        }
        p_Var14 = (in_RDI->m_stack).m_callbacks.m_error;
        pcVar13 = local_4e8;
        Location::Location((Location *)CONCAT17(in_stack_fffffffffffff907,in_stack_fffffffffffff900)
                           ,(char *)in_stack_fffffffffffff8f8,
                           CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                           CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
                           CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
        in_stack_fffffffffffff8e8 = (flag_t)local_500;
        in_stack_fffffffffffff8ec = (undefined4)((ulong)local_500 >> 0x20);
        in_stack_fffffffffffff8f0 = (undefined4)uStack_4f8;
        in_stack_fffffffffffff8f4 = (undefined4)((ulong)uStack_4f8 >> 0x20);
        in_stack_fffffffffffff8d8 = (flag_t)local_510;
        in_stack_fffffffffffff8dc = (flag_t)((ulong)local_510 >> 0x20);
        in_stack_fffffffffffff8e0 = (undefined4)uStack_508;
        in_stack_fffffffffffff8e4 = (undefined4)((ulong)uStack_508 >> 0x20);
        LVar9.super_LineCol.line._0_4_ = in_stack_fffffffffffff8e0;
        LVar9.super_LineCol.offset = local_510;
        LVar9.super_LineCol.line._4_4_ = in_stack_fffffffffffff8e4;
        LVar9.super_LineCol.col._0_4_ = in_stack_fffffffffffff8e8;
        LVar9.super_LineCol.col._4_4_ = in_stack_fffffffffffff8ec;
        LVar9.name.str._0_4_ = in_stack_fffffffffffff8f0;
        LVar9.name.str._4_4_ = in_stack_fffffffffffff8f4;
        LVar9.name.len = (size_t)local_4f0;
        (*p_Var14)(pcVar13,0x1f,LVar9,(in_RDI->m_stack).m_callbacks.m_user_data);
        in_stack_fffffffffffff8f8 = local_4f0;
      }
      bVar10 = has_none(in_RDI,0x40);
      if (!bVar10) {
        builtin_strncpy(local_538,"check failed: (has_none(RKEY))",0x1f);
        eVar11 = get_error_flags();
        if (((eVar11 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
          trap_instruction();
        }
        in_stack_fffffffffffff920 = (Parser *)(in_RDI->m_stack).m_callbacks.m_error;
        pcVar13 = local_538;
        Location::Location((Location *)CONCAT17(in_stack_fffffffffffff907,in_stack_fffffffffffff900)
                           ,(char *)in_stack_fffffffffffff8f8,
                           CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                           CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
                           CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
        (*(code *)in_stack_fffffffffffff920)(pcVar13,0x1f,(in_RDI->m_stack).m_callbacks.m_user_data)
        ;
        in_stack_fffffffffffff8d8 = local_560;
        in_stack_fffffffffffff8dc = fStack_55c;
        in_stack_fffffffffffff8e0 = uStack_558;
        in_stack_fffffffffffff8e4 = uStack_554;
        in_stack_fffffffffffff8f0 = uStack_548;
        in_stack_fffffffffffff8f4 = uStack_544;
        in_stack_fffffffffffff8f8 = local_540;
      }
      basic_substring<const_char>::basic_substring(&local_570);
      bVar10 = _scan_scalar_map_blck
                         (in_stack_ffffffffffffff10,
                          (csubstr *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                          in_stack_ffffffffffffff00);
      if (bVar10) {
        local_148.str = (in_RDI->m_state->line_contents).rem.str;
        local_148.len = (in_RDI->m_state->line_contents).rem.len;
        basic_substring<char_const>::basic_substring<3ul>(local_588,(char (*) [3])0x345ed3);
        pattern_04.str._7_1_ = in_stack_fffffffffffff907;
        pattern_04.str._0_7_ = in_stack_fffffffffffff900;
        pattern_04.len = (size_t)in_stack_fffffffffffff908;
        bVar10 = basic_substring<const_char>::begins_with(in_stack_fffffffffffff8f8,pattern_04);
        if (bVar10) {
          addrem_flags((Parser *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),
                       in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8);
          _push_level(in_stack_fffffffffffff990,(bool)in_stack_fffffffffffff98f);
          _move_scalar_from_top(in_stack_fffffffffffff9e8);
          _move_val_anchor_to_key_anchor(in_stack_fffffffffffff920);
          _start_map(in_stack_fffffffffffffc38,(bool)in_stack_fffffffffffffc37);
          _save_indentation(in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
          addrem_flags((Parser *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),
                       in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8);
          _line_progressed(in_stack_fffffffffffff9c0,(size_t)in_stack_fffffffffffff9b8);
        }
        else {
          bVar10 = basic_substring<const_char>::begins_with(&local_148,':');
          if (bVar10) {
            addrem_flags((Parser *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),
                         in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8);
            _push_level(in_stack_fffffffffffff990,(bool)in_stack_fffffffffffff98f);
            _move_scalar_from_top(in_stack_fffffffffffff9e8);
            _move_val_anchor_to_key_anchor(in_stack_fffffffffffff920);
            _start_map(in_stack_fffffffffffffc38,(bool)in_stack_fffffffffffffc37);
            _save_indentation(in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
            addrem_flags((Parser *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),
                         in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8);
            _line_progressed(in_stack_fffffffffffff9c0,(size_t)in_stack_fffffffffffff9b8);
          }
          else {
            val.len = in_stack_fffffffffffffa58;
            val.str = in_stack_fffffffffffffa50;
            _append_key_val(in_stack_fffffffffffffa48,val,in_stack_fffffffffffffa44);
            addrem_flags((Parser *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),
                         in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8);
          }
        }
        return true;
      }
      basic_substring<char_const>::basic_substring<3ul>
                ((basic_substring<char_const> *)&stack0xfffffffffffffa58,(char (*) [3])0x358c90);
      pattern_05.str._7_1_ = in_stack_fffffffffffff907;
      pattern_05.str._0_7_ = in_stack_fffffffffffff900;
      pattern_05.len = (size_t)in_stack_fffffffffffff908;
      bVar10 = basic_substring<const_char>::begins_with(in_stack_fffffffffffff8f8,pattern_05);
      if (bVar10) {
        addrem_flags((Parser *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),
                     in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8);
        _push_level(in_stack_fffffffffffff990,(bool)in_stack_fffffffffffff98f);
        _move_scalar_from_top(in_stack_fffffffffffff9e8);
        _start_seq(in_stack_fffffffffffffc98,(bool)in_stack_fffffffffffffc97);
        _save_indentation(in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
        _line_progressed(in_stack_fffffffffffff9c0,(size_t)in_stack_fffffffffffff9b8);
        return true;
      }
      local_110 = &local_148;
      local_111 = 0x2d;
      iVar12 = basic_substring<const_char>::compare
                         (in_stack_fffffffffffff8f8,(char)((uint)in_stack_fffffffffffff8f4 >> 0x18))
      ;
      if (iVar12 == 0) {
        _start_unk((Parser *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),
                   SUB41((uint)in_stack_fffffffffffff8dc >> 0x18,0));
        _save_indentation(in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
        _line_progressed(in_stack_fffffffffffff9c0,(size_t)in_stack_fffffffffffff9b8);
        return true;
      }
      bVar10 = basic_substring<const_char>::begins_with(&local_148,'[');
      if (bVar10) {
        addrem_flags((Parser *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),
                     in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8);
        _push_level(in_stack_fffffffffffff990,(bool)in_stack_fffffffffffff98f);
        _move_scalar_from_top(in_stack_fffffffffffff9e8);
        _start_seq(in_stack_fffffffffffffc98,(bool)in_stack_fffffffffffffc97);
        add_flags((Parser *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),
                  in_stack_fffffffffffff8dc);
        _line_progressed(in_stack_fffffffffffff9c0,(size_t)in_stack_fffffffffffff9b8);
        return true;
      }
      bVar10 = basic_substring<const_char>::begins_with(&local_148,'{');
      if (bVar10) {
        addrem_flags((Parser *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),
                     in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8);
        _push_level(in_stack_fffffffffffff990,(bool)in_stack_fffffffffffff98f);
        _move_scalar_from_top(in_stack_fffffffffffff9e8);
        _start_map(in_stack_fffffffffffffc38,(bool)in_stack_fffffffffffffc37);
        addrem_flags((Parser *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),
                     in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8);
        _line_progressed(in_stack_fffffffffffff9c0,(size_t)in_stack_fffffffffffff9b8);
        return true;
      }
      bVar10 = basic_substring<const_char>::begins_with(&local_148,' ');
      if (bVar10) {
        pcVar13 = (char *)basic_substring<const_char>::first_not_of
                                    (in_stack_fffffffffffff908,in_stack_fffffffffffff907,
                                     (size_t)in_stack_fffffffffffff8f8);
        if (local_148.len < pcVar13 && pcVar13 != (char *)0xffffffffffffffff) {
          eVar11 = get_error_flags();
          if (((eVar11 & 1) != 0) &&
             (in_stack_fffffffffffff907 = is_debugger_attached(), (bool)in_stack_fffffffffffff907))
          {
            trap_instruction();
          }
          handle_error(0x344e8b,(char *)0x1569,"check failed: %s","pos <= len || pos == npos");
        }
        if (pcVar13 != (char *)0xffffffffffffffff) {
          basic_substring<const_char>::basic_substring
                    ((basic_substring<const_char> *)
                     CONCAT17(in_stack_fffffffffffff907,in_stack_fffffffffffff900),
                     (char *)in_stack_fffffffffffff8f8,
                     CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0));
        }
        bVar10 = _at_line_begin(in_RDI);
        if (!bVar10) {
          _line_progressed(in_stack_fffffffffffff9c0,(size_t)in_stack_fffffffffffff9b8);
          return true;
        }
        _line_progressed(in_stack_fffffffffffff9c0,(size_t)in_stack_fffffffffffff9b8);
        return true;
      }
      bVar10 = _handle_types(in_stack_ffffffffffffff78);
      if (bVar10) {
        return true;
      }
      bVar10 = _handle_val_anchors_and_refs
                         ((Parser *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40));
      if (bVar10) {
        return true;
      }
      basic_substring<char_const>::basic_substring<5ul>(local_5c8,(char (*) [5])"--- ");
      pattern_06.str._7_1_ = in_stack_fffffffffffff907;
      pattern_06.str._0_7_ = in_stack_fffffffffffff900;
      pattern_06.len = (size_t)in_stack_fffffffffffff908;
      bVar10 = basic_substring<const_char>::begins_with(in_stack_fffffffffffff8f8,pattern_06);
      if (bVar10) {
LAB_002f9726:
        rem_01.str._7_1_ = in_stack_fffffffffffff98f;
        rem_01.str._0_7_ = in_stack_fffffffffffff988;
        rem_01.len = (size_t)in_stack_fffffffffffff990;
        _start_new_doc(in_stack_fffffffffffff980,rem_01);
        return true;
      }
      local_120 = &local_148;
      local_128 = "---";
      iVar12 = basic_substring<const_char>::compare
                         ((basic_substring<const_char> *)
                          CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958),
                          in_stack_fffffffffffff950,in_stack_fffffffffffff948);
      if (iVar12 == 0) goto LAB_002f9726;
      basic_substring<char_const>::basic_substring<5ul>(local_5d8,(char (*) [5])"---\t");
      pattern_07.str._7_1_ = in_stack_fffffffffffff907;
      pattern_07.str._0_7_ = in_stack_fffffffffffff900;
      pattern_07.len = (size_t)in_stack_fffffffffffff908;
      bVar10 = basic_substring<const_char>::begins_with(in_stack_fffffffffffff8f8,pattern_07);
      if (bVar10) goto LAB_002f9726;
      basic_substring<char_const>::basic_substring<4ul>(local_5f8,(char (*) [4])0x33e630);
      pattern_08.str._7_1_ = in_stack_fffffffffffff907;
      pattern_08.str._0_7_ = in_stack_fffffffffffff900;
      pattern_08.len = (size_t)in_stack_fffffffffffff908;
      bVar10 = basic_substring<const_char>::begins_with(in_stack_fffffffffffff8f8,pattern_08);
      if (bVar10) {
        _end_stream(in_stack_fffffffffffffb28);
        _line_progressed(in_stack_fffffffffffff9c0,(size_t)in_stack_fffffffffffff9b8);
        return true;
      }
      bVar10 = is_debugger_attached();
      if ((bVar10) && (bVar10 = is_debugger_attached(), bVar10)) {
        trap_instruction();
      }
      basic_substring<char_const>::basic_substring<19ul>
                (local_608,(char (*) [19])"ERROR: parse error");
      fmt_00.len._0_4_ = in_stack_fffffffffffffdb0;
      fmt_00.str = in_stack_fffffffffffffda8;
      fmt_00.len._4_2_ = in_stack_fffffffffffffdb4;
      fmt_00.len._6_1_ = in_stack_fffffffffffffdb6;
      fmt_00.len._7_1_ = in_stack_fffffffffffffdb7;
      _err<>(in_stack_fffffffffffffda0,fmt_00);
    }
    else {
      bVar10 = is_debugger_attached();
      if ((bVar10) && (bVar10 = is_debugger_attached(), bVar10)) {
        trap_instruction();
      }
      basic_substring<char_const>::basic_substring<22ul>
                ((basic_substring<char_const> *)&stack0xfffffffffffff9e8,
                 (char (*) [22])"ERROR: internal error");
      fmt_01.len._0_4_ = in_stack_fffffffffffffdb0;
      fmt_01.str = in_stack_fffffffffffffda8;
      fmt_01.len._4_2_ = in_stack_fffffffffffffdb4;
      fmt_01.len._6_1_ = in_stack_fffffffffffffdb6;
      fmt_01.len._7_1_ = in_stack_fffffffffffffdb7;
      _err<>(in_stack_fffffffffffffda0,fmt_01);
    }
LAB_002f988d:
    local_129 = false;
  }
  return local_129;
}

Assistant:

bool Parser::_handle_map_blck()
{
    _c4dbgpf("handle_map_blck: node_id={}  level={}", m_state->node_id, m_state->level);
    csubstr rem = m_state->line_contents.rem;

    _RYML_CB_ASSERT(m_stack.m_callbacks, has_all(RMAP));
    _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(FLOW));

    if(rem.begins_with('#'))
    {
        _c4dbgp("it's a comment");
        rem = _scan_comment();
        return true;
    }

    if(has_any(RNXT))
    {
        _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(RKEY));
        _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(RVAL));
        // actually, we don't need RNXT in indent-based maps.
        addrem_flags(RKEY, RNXT);
    }

    if(_handle_indentation())
    {
        _c4dbgp("indentation token");
        return true;
    }

    if(has_any(RKEY))
    {
        _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(RNXT));
        _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(RVAL));

        _c4dbgp("RMAP|RKEY read scalar?");
        bool is_quoted;
        if(_scan_scalar_map_blck(&rem, &is_quoted)) // this also progresses the line
        {
            _c4dbgpf("it's a{} scalar", is_quoted ? " quoted" : "");
            if(has_all(QMRK|SSCL))
            {
                _c4dbgpf("current key is QMRK; SSCL is set. so take store scalar='{}' as key and add an empty val", m_state->scalar);
                _append_key_val_null(rem.str - 1);
            }
            _store_scalar(rem, is_quoted);
            if(has_all(QMRK|RSET))
            {
                _c4dbgp("it's a complex key, so use null value '~'");
                _append_key_val_null(rem.str);
            }
            rem = m_state->line_contents.rem;

            if(rem.begins_with(':'))
            {
                _c4dbgp("wait for val");
                addrem_flags(RVAL, RKEY|QMRK);
                _line_progressed(1);
                rem = m_state->line_contents.rem;
                if(rem.begins_with_any(" \t"))
                {
                    _RYML_CB_ASSERT(m_stack.m_callbacks,  ! _at_line_begin());
                    rem = rem.left_of(rem.first_not_of(" \t"));
                    _c4dbgpf("skip {} spaces/tabs", rem.len);
                    _line_progressed(rem.len);
                }
            }
            return true;
        }
        else if(rem.begins_with_any(" \t"))
        {
            size_t pos = rem.first_not_of(" \t");
            if(pos == npos)
                pos = rem.len;
            _c4dbgpf("skip {} spaces/tabs", pos);
            _line_progressed(pos);
            return true;
        }
        else if(rem == '?' || rem.begins_with("? "))
        {
            _c4dbgp("it's a complex key");
            _line_progressed(rem.begins_with("? ") ? 2u : 1u);
            if(has_any(SSCL))
                _append_key_val_null(rem.str - 1);
            add_flags(QMRK);
            return true;
        }
        else if(has_all(QMRK) && rem.begins_with(':'))
        {
            _c4dbgp("complex key finished");
            if(!has_any(SSCL))
                _store_scalar_null(rem.str);
            addrem_flags(RVAL, RKEY|QMRK);
            _line_progressed(1);
            rem = m_state->line_contents.rem;
            if(rem.begins_with(' '))
            {
                _RYML_CB_ASSERT(m_stack.m_callbacks,  ! _at_line_begin());
                _skipchars(' ');
            }
            return true;
        }
        else if(rem == ':' || rem.begins_with(": ") _RYML_WITH_TAB_TOKENS( || rem.begins_with(":\t")))
        {
            _c4dbgp("key finished");
            if(!has_all(SSCL))
            {
                _c4dbgp("key was empty...");
                _store_scalar_null(rem.str);
                rem_flags(QMRK);
            }
            addrem_flags(RVAL, RKEY);
            _line_progressed(rem == ':' ? 1 : 2);
            return true;
        }
        else if(rem.begins_with("..."))
        {
            _c4dbgp("end current document");
            _end_stream();
            _line_progressed(3);
            return true;
        }
        else if(rem.begins_with("---"))
        {
            _c4dbgp("start new document '---'");
            _start_new_doc(rem);
            return true;
        }
        else if(_handle_types())
        {
            return true;
        }
        else if(_handle_key_anchors_and_refs())
        {
            return true;
        }
        else
        {
            _c4err("parse error");
        }
    }
    else if(has_any(RVAL))
    {
        _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(RNXT));
        _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(RKEY));

        _c4dbgp("RMAP|RVAL read scalar?");
        csubstr s;
        bool is_quoted;
        if(_scan_scalar_map_blck(&s, &is_quoted)) // this also progresses the line
        {
            _c4dbgpf("it's a{} scalar", is_quoted ? " quoted" : "");

            rem = m_state->line_contents.rem;

            if(rem.begins_with(": "))
            {
                _c4dbgp("actually, the scalar is the first key of a map");
                addrem_flags(RKEY, RVAL); // before _push_level! This prepares the current level for popping by setting it to RNXT
                _push_level();
                _move_scalar_from_top();
                _move_val_anchor_to_key_anchor();
                _start_map();
                _save_indentation(m_state->scalar_col);
                addrem_flags(RVAL, RKEY);
                _line_progressed(2);
            }
            else if(rem.begins_with(':'))
            {
                _c4dbgp("actually, the scalar is the first key of a map, and it opens a new scope");
                addrem_flags(RKEY, RVAL); // before _push_level! This prepares the current level for popping by setting it to RNXT
                _push_level();
                _move_scalar_from_top();
                _move_val_anchor_to_key_anchor();
                _start_map();
                _save_indentation(/*behind*/s.len);
                addrem_flags(RVAL, RKEY);
                _line_progressed(1);
            }
            else
            {
                _c4dbgp("appending keyval to current map");
                _append_key_val(s, is_quoted);
                addrem_flags(RKEY, RVAL);
            }
            return true;
        }
        else if(rem.begins_with("- ") _RYML_WITH_TAB_TOKENS( || rem.begins_with("-\t")))
        {
            _c4dbgp("val is a nested seq, indented");
            addrem_flags(RKEY, RVAL); // before _push_level!
            _push_level();
            _move_scalar_from_top();
            _start_seq();
            _save_indentation();
            _line_progressed(2);
            return true;
        }
        else if(rem == '-')
        {
            _c4dbgp("maybe a seq. start unknown, indented");
            _start_unk();
            _save_indentation();
            _line_progressed(1);
            return true;
        }
        else if(rem.begins_with('['))
        {
            _c4dbgp("val is a child seq, flow");
            addrem_flags(RKEY, RVAL); // before _push_level!
            _push_level(/*explicit flow*/true);
            _move_scalar_from_top();
            _start_seq();
            add_flags(FLOW);
            _line_progressed(1);
            return true;
        }
        else if(rem.begins_with('{'))
        {
            _c4dbgp("val is a child map, flow");
            addrem_flags(RKEY, RVAL); // before _push_level!
            _push_level(/*explicit flow*/true);
            _move_scalar_from_top();
            _start_map();
            addrem_flags(FLOW|RKEY, RVAL);
            _line_progressed(1);
            return true;
        }
        else if(rem.begins_with(' '))
        {
            csubstr spc = rem.left_of(rem.first_not_of(' '));
            if(_at_line_begin())
            {
                _c4dbgpf("skipping value indentation: {} spaces", spc.len);
                _line_progressed(spc.len);
                return true;
            }
            else
            {
                _c4dbgpf("skipping {} spaces", spc.len);
                _line_progressed(spc.len);
                return true;
            }
        }
        else if(_handle_types())
        {
            return true;
        }
        else if(_handle_val_anchors_and_refs())
        {
            return true;
        }
        else if(rem.begins_with("--- ") || rem == "---" || rem.begins_with("---\t"))
        {
            _start_new_doc(rem);
            return true;
        }
        else if(rem.begins_with("..."))
        {
            _c4dbgp("end current document");
            _end_stream();
            _line_progressed(3);
            return true;
        }
        else
        {
            _c4err("parse error");
        }
    }
    else
    {
        _c4err("internal error");
    }

    return false;
}